

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

bool testing::internal::TuplePrefix<2ul>::
     Matches<std::tuple<testing::Matcher<void*>,testing::Matcher<unsigned_long>>,std::tuple<void*,unsigned_long>>
               (tuple<testing::Matcher<void_*>,_testing::Matcher<unsigned_long>_> *matcher_tuple,
               tuple<void_*,_unsigned_long> *value_tuple)

{
  bool bVar1;
  MatcherBase<unsigned_long> *this;
  __tuple_element_t<1UL,_tuple<void_*,_unsigned_long>_> *x;
  undefined1 local_19;
  tuple<void_*,_unsigned_long> *value_tuple_local;
  tuple<testing::Matcher<void_*>,_testing::Matcher<unsigned_long>_> *matcher_tuple_local;
  
  bVar1 = TuplePrefix<1ul>::
          Matches<std::tuple<testing::Matcher<void*>,testing::Matcher<unsigned_long>>,std::tuple<void*,unsigned_long>>
                    (matcher_tuple,value_tuple);
  local_19 = false;
  if (bVar1) {
    this = &std::get<1ul,testing::Matcher<void*>,testing::Matcher<unsigned_long>>(matcher_tuple)->
            super_MatcherBase<unsigned_long>;
    x = std::get<1ul,void*,unsigned_long>(value_tuple);
    local_19 = MatcherBase<unsigned_long>::Matches(this,x);
  }
  return local_19;
}

Assistant:

static bool Matches(const MatcherTuple& matcher_tuple,
                      const ValueTuple& value_tuple) {
    return TuplePrefix<N - 1>::Matches(matcher_tuple, value_tuple) &&
           std::get<N - 1>(matcher_tuple).Matches(std::get<N - 1>(value_tuple));
  }